

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O2

bool libtest::unit_test<libtest::a_plus_b>::check<(anonymous_namespace)::ac>(path *input_file_path)

{
  usize args_3;
  bool bVar1;
  int iVar2;
  istream *this;
  ostream *poVar3;
  long lVar4;
  istream *piVar5;
  path generated_out_path;
  int b;
  undefined8 local_7a8;
  undefined1 local_7a0 [16];
  path solution_out_path;
  path local_768;
  path local_740;
  path local_718;
  path local_6f0;
  path local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  int a;
  usize time_ms;
  time_point start;
  
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::input_file);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file
                );
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   input_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           input_file);
    }
  }
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::generated_output_file
      == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::generated_output_file);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 generated_output_file);
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   generated_output_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           generated_output_file);
    }
  }
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
      solution_output_file_in == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::solution_output_file_in);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file_in);
      __cxa_atexit(std::ifstream::~ifstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   solution_output_file_in,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           solution_output_file_in);
    }
  }
  if (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::solution_output_file
      == '\0') {
    iVar2 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                 ::solution_output_file);
    if (iVar2 != 0) {
      std::ofstream::ofstream
                (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file);
      __cxa_atexit(std::ofstream::~ofstream,
                   check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                   solution_output_file,&__dso_handle);
      __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                           solution_output_file);
    }
  }
  cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[ RUN      ] ");
  std::filesystem::__cxx11::path::filename(&local_6c8,input_file_path);
  cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_6c8);
  std::filesystem::__cxx11::path::~path(&local_6c8);
  std::filesystem::__cxx11::path::path(&solution_out_path,input_file_path);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            ((path *)&a,(char (*) [5])".txt",auto_format);
  std::filesystem::__cxx11::path::replace_extension(&solution_out_path);
  std::filesystem::__cxx11::path::~path((path *)&a);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)
             check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file,
             input_file_path,_S_in);
  std::ofstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                      solution_output_file,
                      (_Ios_Openmode)solution_out_path._M_pathname._M_dataplus._M_p);
  time_ms = 200;
  start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  generated_out_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  _a = (pointer)operator_new(0x18);
  *(undefined ***)_a = &PTR___State_0010dcb0;
  *(usize **)((long)_a + 8) = &time_ms;
  *(time_point **)((long)_a + 0x10) = &start;
  std::thread::_M_start_thread(&generated_out_path,&a,0);
  if ((long *)_a != (long *)0x0) {
    (**(code **)(*(long *)_a + 8))();
  }
  this = (istream *)
         std::istream::operator>>
                   ((istream *)
                    check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                    input_file,&a);
  std::istream::operator>>(this,&b);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)
                      check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                      solution_output_file,b + a);
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar4 = std::chrono::_V2::system_clock::now();
  time_ms = (lVar4 - (long)start.__d.__r) / 1000000;
  std::thread::join();
  args_3 = time_ms;
  std::thread::~thread((thread *)&generated_out_path);
  std::ifstream::close();
  std::ofstream::close();
  if (args_3 < 100) {
    std::filesystem::__cxx11::path::path(&generated_out_path,input_file_path);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              ((path *)&a,(char (*) [5])".out",auto_format);
    std::filesystem::__cxx11::path::replace_extension(&generated_out_path);
    std::filesystem::__cxx11::path::~path((path *)&a);
    bVar1 = std::filesystem::exists(&generated_out_path);
    if (bVar1) {
      std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file
                 ,input_file_path,_S_in);
      std::ifstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                          generated_output_file,
                          (_Ios_Openmode)generated_out_path._M_pathname._M_dataplus._M_p);
      std::ifstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                          solution_output_file_in,
                          (_Ios_Openmode)solution_out_path._M_pathname._M_dataplus._M_p);
      bVar1 = a_plus_b::judge((ifstream *)
                              check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                              ::input_file,
                              (ifstream *)
                              check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                              ::generated_output_file,
                              (ifstream *)
                              check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                              ::solution_output_file_in);
      if (bVar1) {
        cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[       AC ] ");
        std::filesystem::__cxx11::path::filename(&local_740,input_file_path);
        cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                  ((ansi_sgr)0x25,"% (% ms)\n",&local_740,args_3);
        std::filesystem::__cxx11::path::~path(&local_740);
      }
      else {
        cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x1f,"[       WA ] ");
        std::filesystem::__cxx11::path::filename(&local_718,input_file_path);
        cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                  ((ansi_sgr)0x25,"% (% ms)\n",&local_718,args_3);
        std::filesystem::__cxx11::path::~path(&local_718);
        std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                  ((ifstream *)&a,input_file_path,_S_in);
        std::ifstream::ifstream(&time_ms,generated_out_path._M_pathname._M_dataplus._M_p,_S_in);
        std::ifstream::ifstream(&start,solution_out_path._M_pathname._M_dataplus._M_p,_S_in);
        _b = local_7a0;
        local_7a8 = 0;
        local_7a0[0] = 0;
        cprintln<libtest::ansi_sgr,char_const*>((ansi_sgr)0x25,"(Input)");
        while( true ) {
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&a,(string *)&b);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          std::__cxx11::string::string((string *)&local_660,(string *)&b);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>((ansi_sgr)0x25,&local_660);
          std::__cxx11::string::~string((string *)&local_660);
        }
        cprintln<libtest::ansi_sgr,char_const*>((ansi_sgr)0x25,"(Expected)");
        while( true ) {
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&time_ms,(string *)&b);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          std::__cxx11::string::string((string *)&local_680,(string *)&b);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>((ansi_sgr)0x25,&local_680);
          std::__cxx11::string::~string((string *)&local_680);
        }
        cprintln<libtest::ansi_sgr,char_const*>((ansi_sgr)0x25,"(Output)");
        while( true ) {
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&start,(string *)&b);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          std::__cxx11::string::string((string *)&local_6a0,(string *)&b);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>((ansi_sgr)0x25,&local_6a0);
          std::__cxx11::string::~string((string *)&local_6a0);
        }
        std::__cxx11::string::~string((string *)&b);
        std::ifstream::~ifstream(&start);
        std::ifstream::~ifstream(&time_ms);
        std::ifstream::~ifstream(&a);
      }
      std::ifstream::close();
    }
    else {
      cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x20,"[       OK ] ");
      std::filesystem::__cxx11::path::filename(&local_768,input_file_path);
      cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                ((ansi_sgr)0x25,"% (% ms)\n",&local_768,args_3);
      std::filesystem::__cxx11::path::~path(&local_768);
      bVar1 = true;
    }
    std::filesystem::__cxx11::path::~path(&generated_out_path);
  }
  else {
    cprintf<libtest::ansi_sgr,char_const*>((ansi_sgr)0x1f,"[      TLE ] ");
    std::filesystem::__cxx11::path::filename(&local_6f0,input_file_path);
    cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
              ((ansi_sgr)0x25,"% (% ms)\n",&local_6f0,args_3);
    std::filesystem::__cxx11::path::~path(&local_6f0);
    bVar1 = false;
  }
  std::ifstream::close();
  std::ifstream::close();
  std::ofstream::close();
  std::filesystem::__cxx11::path::~path(&solution_out_path);
  return bVar1;
}

Assistant:

static bool check(const fs::path& input_file_path)
    {
        static std::ifstream input_file, generated_output_file, solution_output_file_in;
        static std::ofstream solution_output_file;
        cprintf(ac_color, "[ RUN      ] "), cprintln(message_color, input_file_path.filename());
        auto solution_out_path = input_file_path;
        solution_out_path.replace_extension(".txt");
        input_file.open(input_file_path), solution_output_file.open(solution_out_path);
        const usize time_ms = run([&]() { Solution::solve(input_file, solution_output_file); });
        input_file.close(), solution_output_file.close();
        bool passed = false;
        if (time_ms >= Problem::time_limit) {
            cprintf(tle_color, "[      TLE ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
        } else {
            auto generated_out_path = input_file_path;
            generated_out_path.replace_extension(".out");
            if (fs::exists(generated_out_path)) {
                input_file.open(input_file_path), generated_output_file.open(generated_out_path), solution_output_file_in.open(solution_out_path);
                const bool ok = Problem::judge(input_file, generated_output_file, solution_output_file_in);
                if (not ok) {
                    cprintf(wa_color, "[       WA ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    std::ifstream in_file{input_file_path}, gen_file{generated_out_path}, sol_file{solution_out_path};
                    std::string line;
                    cprintln(message_color, "(Input)");
                    while (std::getline(in_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Expected)");
                    while (std::getline(gen_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Output)");
                    while (std::getline(sol_file, line)) { cprintln(message_color, line); }
                } else {
                    cprintf(ac_color, "[       AC ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    passed = true;
                }
                solution_output_file_in.close();
            } else {
                cprintf(ac_color, "[       OK ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                passed = true;
            }
        }
        generated_output_file.close(), input_file.close(), solution_output_file.close();
        return passed;
    }